

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O0

uchar * od_ec_enc_done(od_ec_enc *enc,uint32_t *nbytes)

{
  short sVar1;
  ulong uVar2;
  uint *in_RSI;
  undefined8 *in_RDI;
  uint16_t val;
  uint64_t n;
  int b;
  int s_bits;
  int s;
  int c;
  od_ec_enc_window l;
  od_ec_enc_window e;
  od_ec_enc_window m;
  uint32_t offs;
  uint32_t storage;
  uchar *out;
  int local_60;
  ulong local_58;
  int local_48;
  int local_44;
  ulong local_38;
  uint local_28;
  uchar *local_20;
  uchar *local_8;
  
  if (*(int *)((long)in_RDI + 0x1c) == 0) {
    sVar1 = *(short *)((long)in_RDI + 0x1a);
    local_44 = (int)sVar1;
    local_38 = in_RDI[2] + 0x3fff & 0xffffffffffffc000 | 0x4000;
    local_48 = local_44 + 10;
    local_28 = *(uint *)((long)in_RDI + 0xc);
    local_20 = (uchar *)*in_RDI;
    local_60 = local_44 + 0x11 >> 3;
    if (local_60 < 1) {
      local_60 = 0;
    }
    if (*(uint *)(in_RDI + 1) < local_28 + local_60) {
      local_20 = (uchar *)realloc(local_20,(ulong)(local_28 + local_60));
      if (local_20 == (uchar *)0x0) {
        *(undefined4 *)((long)in_RDI + 0x1c) = 0xffffffff;
        return (uchar *)0x0;
      }
      *in_RDI = local_20;
      *(uint *)(in_RDI + 1) = local_28 + local_60;
    }
    if (0 < local_48) {
      local_58 = (1L << ((char)sVar1 + 0x10U & 0x3f)) - 1;
      do {
        uVar2 = local_38 >> ((char)local_44 + 0x10U & 0x3f);
        local_20[local_28] = (uchar)uVar2;
        if ((uVar2 & 0x100) != 0) {
          propagate_carry_bwd(local_20,local_28 - 1);
        }
        local_28 = local_28 + 1;
        local_38 = local_58 & local_38;
        local_48 = local_48 + -8;
        local_44 = local_44 + -8;
        local_58 = local_58 >> 8;
      } while (0 < local_48);
    }
    *in_RSI = local_28;
    local_8 = local_20;
  }
  else {
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

unsigned char *od_ec_enc_done(od_ec_enc *enc, uint32_t *nbytes) {
  unsigned char *out;
  uint32_t storage;
  uint32_t offs;
  od_ec_enc_window m;
  od_ec_enc_window e;
  od_ec_enc_window l;
  int c;
  int s;
  if (enc->error) return NULL;
#if OD_MEASURE_EC_OVERHEAD
  {
    uint32_t tell;
    /* Don't count the 1 bit we lose to raw bits as overhead. */
    tell = od_ec_enc_tell(enc) - 1;
    fprintf(stderr, "overhead: %f%%\n",
            100 * (tell - enc->entropy) / enc->entropy);
    fprintf(stderr, "efficiency: %f bits/symbol\n",
            (double)tell / enc->nb_symbols);
  }
#endif

  l = enc->low;
  c = enc->cnt;
  s = 10;
  m = 0x3FFF;
  e = ((l + m) & ~m) | (m + 1);
  s += c;
  offs = enc->offs;

  /*Make sure there's enough room for the entropy-coded bits.*/
  out = enc->buf;
  storage = enc->storage;
  const int s_bits = (s + 7) >> 3;
  int b = OD_MAXI(s_bits, 0);
  if (offs + b > storage) {
    storage = offs + b;
    out = (unsigned char *)realloc(out, sizeof(*out) * storage);
    if (out == NULL) {
      enc->error = -1;
      return NULL;
    }
    enc->buf = out;
    enc->storage = storage;
  }

  /*We output the minimum number of bits that ensures that the symbols encoded
     thus far will be decoded correctly regardless of the bits that follow.*/
  if (s > 0) {
    uint64_t n;
    n = ((uint64_t)1 << (c + 16)) - 1;
    do {
      assert(offs < storage);
      uint16_t val = (uint16_t)(e >> (c + 16));
      out[offs] = (unsigned char)(val & 0x00FF);
      if (val & 0x0100) {
        assert(offs > 0);
        propagate_carry_bwd(out, offs - 1);
      }
      offs++;

      e &= n;
      s -= 8;
      c -= 8;
      n >>= 8;
    } while (s > 0);
  }
  *nbytes = offs;

  return out;
}